

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-print.cc
# Opt level: O0

void __thiscall IR::Print::visit(Print *this,Save *s)

{
  basic_ostream<char,_std::char_traits<char>_> *os;
  Temp *this_00;
  string *args;
  Save *s_local;
  Print *this_local;
  
  os = this->out;
  this_00 = Save::target(s);
  args = Temp::name_abi_cxx11_(this_00);
  fmt::v7::print<char[17],std::__cxx11::string_const&,char>
            (os,(char (*) [17])"\t{0} = yycursor;",args);
  std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Print::visit(IR::Save* s) {
  fmt::print(out, "\t{0} = yycursor;", s->target()->name());
  out << std::endl;
}